

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

QColor __thiscall QTextEdit::textBackgroundColor(QTextEdit *this)

{
  QColor QVar1;
  long in_FS_OFFSET;
  QWidgetTextControl aQStack_58 [8];
  long local_50;
  QTextFormat local_48 [16];
  QColor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QWidgetTextControl::textCursor(aQStack_58);
  QTextCursor::charFormat();
  QTextFormat::brushProperty((int)&local_50);
  QTextFormat::~QTextFormat(local_48);
  QTextCursor::~QTextCursor((QTextCursor *)aQStack_58);
  if (*(int *)(local_50 + 4) == 0) {
    QColor::QColor(&local_38,transparent);
  }
  else {
    local_38._0_8_ = *(undefined8 *)(local_50 + 8);
    local_38._8_8_ = *(undefined8 *)(local_50 + 0x10);
  }
  QBrush::~QBrush((QBrush *)&local_50);
  QVar1._8_8_ = local_38._8_8_;
  QVar1._0_8_ = local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QColor QTextEdit::textBackgroundColor() const
{
    Q_D(const QTextEdit);
    const QBrush &brush = d->control->textCursor().charFormat().background();
    return brush.style() == Qt::NoBrush ? Qt::transparent : brush.color();
}